

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O2

bool __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  CornerTable *pCVar1;
  const_reference cVar2;
  bool bVar3;
  bool bVar4;
  CornerIndex corner_id_00;
  int iVar5;
  uint uVar6;
  CornerIndex CVar7;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> vert_id;
  FaceIndex face_id;
  FaceIndex face_id_00;
  CornerIndex corner_id_local;
  
  if ((this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    return true;
  }
  corner_id_local = corner_id;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back(this->traversal_stacks_,&corner_id_local);
  this->best_priority_ = 0;
  if (corner_id_local.value_ == 0xffffffff) {
    IVar8.value_ = 0xffffffff;
    vert_id.value_ = 0xffffffff;
  }
  else {
    pCVar1 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    uVar6 = corner_id_local.value_ - 2;
    if ((corner_id_local.value_ + 1) % 3 != 0) {
      uVar6 = corner_id_local.value_ + 1;
    }
    if (uVar6 == 0xffffffff) {
      IVar8.value_ = 0xffffffff;
    }
    else {
      IVar8.value_ = (pCVar1->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
    }
    if (corner_id_local.value_ % 3 == 0) {
      uVar6 = corner_id_local.value_ + 2;
      if (uVar6 == 0xffffffff) {
        vert_id.value_ = 0xffffffff;
        goto LAB_00124d70;
      }
    }
    else {
      uVar6 = corner_id_local.value_ - 1;
    }
    vert_id.value_ =
         (pCVar1->corner_to_vertex_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
  }
LAB_00124d70:
  this_00 = &(this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_;
  cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)IVar8.value_);
  if (!cVar2) {
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::MarkVertexVisited(&this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ,(VertexIndex)IVar8.value_);
    if (corner_id_local.value_ == 0xffffffff) {
      CVar7.value_ = 0xffffffff;
    }
    else {
      CVar7.value_ = corner_id_local.value_ - 2;
      if ((corner_id_local.value_ + 1) % 3 != 0) {
        CVar7.value_ = corner_id_local.value_ + 1;
      }
    }
    MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
              (&(this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_,(VertexIndex)IVar8.value_,CVar7);
  }
  cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)vert_id.value_);
  if (!cVar2) {
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::MarkVertexVisited(&this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ,(VertexIndex)vert_id.value_);
    if (corner_id_local.value_ == 0xffffffff) {
      CVar7.value_ = 0xffffffff;
    }
    else if (corner_id_local.value_ % 3 == 0) {
      CVar7.value_ = corner_id_local.value_ + 2;
    }
    else {
      CVar7.value_ = corner_id_local.value_ - 1;
    }
    MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
              (&(this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_,(VertexIndex)vert_id.value_,CVar7);
  }
  if ((ulong)corner_id_local.value_ == 0xffffffff) {
    IVar8.value_ = 0xffffffff;
  }
  else {
    IVar8.value_ = (((this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).corner_table_)->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[corner_id_local.value_].value_;
  }
  cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)IVar8.value_);
  if (!cVar2) {
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::MarkVertexVisited(&this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ,(VertexIndex)IVar8.value_);
    MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
              (&(this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_,(VertexIndex)IVar8.value_,corner_id_local);
  }
LAB_00124e54:
  do {
    do {
      corner_id_local = PopNextCornerToTraverse(this);
      if (corner_id_local.value_ == 0xffffffff) {
        return true;
      }
      bVar3 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::IsFaceVisited(&this->
                               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ,(FaceIndex)(corner_id_local.value_ / 3));
      CVar7.value_ = corner_id_local.value_;
    } while (bVar3);
LAB_00124e81:
    do {
      corner_id_local.value_ = CVar7.value_;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkFaceVisited(&this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ,(FaceIndex)(corner_id_local.value_ / 3));
      IVar8.value_ = 0xffffffff;
      if ((ulong)corner_id_local.value_ != 0xffffffff) {
        IVar8.value_ = (((this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                         ).corner_table_)->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[corner_id_local.value_].value_;
      }
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)IVar8.value_);
      if (!cVar2) {
        TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
        ::MarkVertexVisited(&this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                            ,(VertexIndex)IVar8.value_);
        MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                  (&(this->
                    super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                    ).traversal_observer_,(VertexIndex)IVar8.value_,corner_id_local);
      }
      corner_id_00 = CornerTable::GetRightCorner
                               ((this->
                                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                ).corner_table_,corner_id_local);
      CVar7 = CornerTable::GetLeftCorner
                        ((this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                         ).corner_table_,corner_id_local);
      face_id.value_ = corner_id_00.value_ / 3;
      if (corner_id_00.value_ == 0xffffffff) {
        face_id.value_ = 0xffffffff;
      }
      face_id_00.value_ = CVar7.value_ / 3;
      if (CVar7.value_ == 0xffffffff) {
        face_id_00.value_ = 0xffffffff;
      }
      bVar3 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::IsFaceVisited(&this->
                               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ,face_id);
      bVar4 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::IsFaceVisited(&this->
                               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ,face_id_00);
      if (!bVar4) {
        iVar5 = ComputePriority(this,CVar7);
        if (bVar3 && iVar5 <= this->best_priority_) goto LAB_00124e81;
        AddCornerToTraversalStack(this,CVar7,iVar5);
      }
      if (bVar3) goto LAB_00124e54;
      iVar5 = ComputePriority(this,corner_id_00);
      CVar7 = corner_id_00;
    } while (iVar5 <= this->best_priority_);
    AddCornerToTraversalStack(this,corner_id_00,iVar5);
  } while( true );
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (prediction_degree_.size() == 0) {
      return true;
    }

    // Traversal starts from the |corner_id|. It's going to follow either the
    // right or the left neighboring faces to |corner_id| based on their
    // prediction degree.
    traversal_stacks_[0].push_back(corner_id);
    best_priority_ = 0;
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }
    const VertexIndex tip_vertex = this->corner_table()->Vertex(corner_id);
    if (!this->IsVertexVisited(tip_vertex)) {
      this->MarkVertexVisited(tip_vertex);
      this->traversal_observer().OnNewVertexVisited(tip_vertex, corner_id);
    }
    // Start the actual traversal.
    while ((corner_id = PopNextCornerToTraverse()) != kInvalidCornerIndex) {
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        continue;
      }

      while (true) {
        face_id = FaceIndex(corner_id.value() / 3);
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);

        // If the newly reached vertex hasn't been visited, mark it and notify
        // the observer.
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (!this->IsVertexVisited(vert_id)) {
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
        }

        // Check whether we can traverse to the right and left neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        const bool is_right_face_visited = this->IsFaceVisited(right_face_id);
        const bool is_left_face_visited = this->IsFaceVisited(left_face_id);

        if (!is_left_face_visited) {
          // We can go to the left face.
          const int priority = ComputePriority(left_corner_id);
          if (is_right_face_visited && priority <= best_priority_) {
            // Right face has been already visited and the priority is equal or
            // better than the best priority. We are sure that the left face
            // would be traversed next so there is no need to put it onto the
            // stack.
            corner_id = left_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(left_corner_id, priority);
          }
        }
        if (!is_right_face_visited) {
          // Go to the right face.
          const int priority = ComputePriority(right_corner_id);
          if (priority <= best_priority_) {
            // We are sure that the right face would be traversed next so there
            // is no need to put it onto the stack.
            corner_id = right_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(right_corner_id, priority);
          }
        }

        // Couldn't proceed directly to the next corner
        break;
      }
    }
    return true;
  }